

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR moveto_axis_scnode_next_first
                 (lysc_node **iter,lyxp_node_type *iter_type,lys_module **iter_mod,
                 uint32_t *iter_mod_idx,lysc_node *scnode,lyxp_node_type node_type,lyxp_axis axis,
                 lyxp_set *set,uint32_t getnext_opts)

{
  LY_ERR LVar1;
  lys_module *plVar2;
  lysc_node *plVar3;
  lysc_node *local_78;
  lysc_node *local_70;
  lyxp_node_type local_5c;
  lysc_node *local_58;
  lyxp_node_type local_44;
  lysc_node *plStack_40;
  lyxp_node_type next_type;
  lysc_node *next;
  lyxp_node_type node_type_local;
  lysc_node *scnode_local;
  uint32_t *iter_mod_idx_local;
  lys_module **iter_mod_local;
  lyxp_node_type *iter_type_local;
  lysc_node **iter_local;
  
  plStack_40 = (lysc_node *)0x0;
  local_44 = LYXP_NODE_NONE;
  if (*iter != (lysc_node *)0x0) {
    __assert_fail("!*iter",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0x195d,
                  "LY_ERR moveto_axis_scnode_next_first(const struct lysc_node **, enum lyxp_node_type *, const struct lys_module **, uint32_t *, const struct lysc_node *, enum lyxp_node_type, enum lyxp_axis, struct lyxp_set *, uint32_t)"
                 );
  }
  if (*iter_type != LYXP_NODE_NONE) {
    __assert_fail("!*iter_type",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0x195e,
                  "LY_ERR moveto_axis_scnode_next_first(const struct lysc_node **, enum lyxp_node_type *, const struct lys_module **, uint32_t *, const struct lysc_node *, enum lyxp_node_type, enum lyxp_axis, struct lyxp_set *, uint32_t)"
                 );
  }
  *iter_mod = (lys_module *)0x0;
  *iter_mod_idx = 0;
  switch(axis) {
  case LYXP_AXIS_ANCESTOR:
  case LYXP_AXIS_PARENT:
    if (node_type == LYXP_NODE_ELEM) {
      if (scnode == (lysc_node *)0x0) {
        local_58 = (lysc_node *)0x0;
      }
      else {
        local_58 = scnode->parent;
      }
      plStack_40 = lysc_data_node(local_58);
      if (plStack_40 == (lysc_node *)0x0) {
        local_5c = set->root_type;
      }
      else {
        local_5c = LYXP_NODE_ELEM;
      }
      local_44 = local_5c;
    }
    break;
  case LYXP_AXIS_ANCESTOR_OR_SELF:
  case LYXP_AXIS_DESCENDANT_OR_SELF:
  case LYXP_AXIS_SELF:
    if (((node_type == LYXP_NODE_ROOT_CONFIG) || (node_type == LYXP_NODE_ROOT)) ||
       (node_type == LYXP_NODE_ELEM)) {
      local_44 = node_type;
      plStack_40 = scnode;
    }
    break;
  case LYXP_AXIS_ATTRIBUTE:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0x19a6,
                  "LY_ERR moveto_axis_scnode_next_first(const struct lysc_node **, enum lyxp_node_type *, const struct lys_module **, uint32_t *, const struct lysc_node *, enum lyxp_node_type, enum lyxp_axis, struct lyxp_set *, uint32_t)"
                 );
  case LYXP_AXIS_CHILD:
  case LYXP_AXIS_DESCENDANT:
    if ((node_type == LYXP_NODE_ROOT_CONFIG) || (node_type == LYXP_NODE_ROOT)) {
      do {
        plVar2 = ly_ctx_get_module_iter(set->ctx,iter_mod_idx);
        *iter_mod = plVar2;
        if (plVar2 == (lys_module *)0x0) goto switchD_0021f456_default;
      } while (((*iter_mod)->compiled == (lysc_module *)0x0) ||
              (plStack_40 = lys_getnext((lysc_node *)0x0,(lysc_node *)0x0,(*iter_mod)->compiled,
                                        getnext_opts), plStack_40 == (lysc_node *)0x0));
      local_44 = LYXP_NODE_ELEM;
    }
    else if (node_type == LYXP_NODE_ELEM) {
      plStack_40 = lys_getnext((lysc_node *)0x0,scnode,(lysc_module *)0x0,getnext_opts);
      local_44 = LYXP_NODE_NONE;
      if (plStack_40 != (lysc_node *)0x0) {
        local_44 = LYXP_NODE_ELEM;
      }
    }
    break;
  case LYXP_AXIS_FOLLOWING:
  case LYXP_AXIS_FOLLOWING_SIBLING:
    if (node_type == LYXP_NODE_ELEM) {
      if (scnode == (lysc_node *)0x0) {
        local_70 = (lysc_node *)0x0;
      }
      else {
        local_70 = scnode->parent;
      }
      plVar3 = lysc_data_node(local_70);
      plStack_40 = lys_getnext(scnode,plVar3,scnode->module->compiled,getnext_opts);
      local_44 = LYXP_NODE_NONE;
      if (plStack_40 != (lysc_node *)0x0) {
        local_44 = LYXP_NODE_ELEM;
      }
    }
    break;
  case LYXP_AXIS_PRECEDING:
  case LYXP_AXIS_PRECEDING_SIBLING:
    if (node_type == LYXP_NODE_ELEM) {
      if (scnode == (lysc_node *)0x0) {
        local_78 = (lysc_node *)0x0;
      }
      else {
        local_78 = scnode->parent;
      }
      plVar3 = lysc_data_node(local_78);
      plStack_40 = lys_getnext((lysc_node *)0x0,plVar3,scnode->module->compiled,getnext_opts);
      if (plStack_40 == scnode) {
        plStack_40 = (lysc_node *)0x0;
      }
      local_44 = LYXP_NODE_NONE;
      if (plStack_40 != (lysc_node *)0x0) {
        local_44 = LYXP_NODE_ELEM;
      }
    }
  }
switchD_0021f456_default:
  *iter = plStack_40;
  *iter_type = local_44;
  LVar1 = LY_ENOTFOUND;
  if (local_44 != LYXP_NODE_NONE) {
    LVar1 = LY_SUCCESS;
  }
  return LVar1;
}

Assistant:

static LY_ERR
moveto_axis_scnode_next_first(const struct lysc_node **iter, enum lyxp_node_type *iter_type, const struct lys_module **iter_mod,
        uint32_t *iter_mod_idx, const struct lysc_node *scnode, enum lyxp_node_type node_type, enum lyxp_axis axis,
        struct lyxp_set *set, uint32_t getnext_opts)
{
    const struct lysc_node *next = NULL;
    enum lyxp_node_type next_type = 0;

    assert(!*iter);
    assert(!*iter_type);

    *iter_mod = NULL;
    *iter_mod_idx = 0;

    switch (axis) {
    case LYXP_AXIS_ANCESTOR_OR_SELF:
    case LYXP_AXIS_DESCENDANT_OR_SELF:
    case LYXP_AXIS_SELF:
        if ((node_type == LYXP_NODE_ROOT_CONFIG) || (node_type == LYXP_NODE_ROOT) || (node_type == LYXP_NODE_ELEM)) {
            /* just return the node */
            next = scnode;
            next_type = node_type;
        }
        break;

    case LYXP_AXIS_ANCESTOR:
    case LYXP_AXIS_PARENT:
        if (node_type == LYXP_NODE_ELEM) {
            next = lysc_data_parent(scnode);
            next_type = next ? LYXP_NODE_ELEM : set->root_type;
        } /* else no parent */
        break;

    case LYXP_AXIS_DESCENDANT:
    case LYXP_AXIS_CHILD:
        if ((node_type == LYXP_NODE_ROOT_CONFIG) || (node_type == LYXP_NODE_ROOT)) {
            /* it can actually be in any module, it's all <running>, and even if it's moveto_mod (if set),
             * it can be in a top-level augment */
            while ((*iter_mod = ly_ctx_get_module_iter(set->ctx, iter_mod_idx))) {
                /* module may not be implemented or not compiled yet */
                if (!(*iter_mod)->compiled) {
                    continue;
                }

                /* get next node */
                if ((next = lys_getnext(NULL, NULL, (*iter_mod)->compiled, getnext_opts))) {
                    next_type = LYXP_NODE_ELEM;
                    break;
                }
            }
        } else if (node_type == LYXP_NODE_ELEM) {
            /* get next node */
            next = lys_getnext(NULL, scnode, NULL, getnext_opts);
            next_type = next ? LYXP_NODE_ELEM : 0;
        }
        break;

    case LYXP_AXIS_FOLLOWING:
    case LYXP_AXIS_FOLLOWING_SIBLING:
        if (node_type == LYXP_NODE_ELEM) {
            /* first next sibling */
            next = lys_getnext(scnode, lysc_data_parent(scnode), scnode->module->compiled, getnext_opts);
            next_type = next ? LYXP_NODE_ELEM : 0;
        } /* else no sibling */
        break;

    case LYXP_AXIS_PRECEDING:
    case LYXP_AXIS_PRECEDING_SIBLING:
        if (node_type == LYXP_NODE_ELEM) {
            /* first parent sibling */
            next = lys_getnext(NULL, lysc_data_parent(scnode), scnode->module->compiled, getnext_opts);
            if (next == scnode) {
                /* no preceding sibling */
                next = NULL;
            }
            next_type = next ? LYXP_NODE_ELEM : 0;
        } /* else no sibling */
        break;

    case LYXP_AXIS_ATTRIBUTE:
        /* unreachable */
        assert(0);
        LOGINT(set->ctx);
        break;
    }

    *iter = next;
    *iter_type = next_type;
    return next_type ? LY_SUCCESS : LY_ENOTFOUND;
}